

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::compute_split_estimate
          (clusterizer<crnlib::vec<6U,_float>_> *this,vec<6U,_float> *left_child_res,
          vec<6U,_float> *right_child_res,vq_node *parent_node)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *this_00;
  float fVar4;
  double dVar5;
  vec<6U,_float> local_f8;
  vec<6U,_float> local_e0;
  vec<6U,_float> local_c8;
  vec<6U,_float> local_b0;
  double local_98;
  double dist_1;
  vec<6U,_float> *v_1;
  double dStack_80;
  uint i_1;
  double opposite_dist;
  vec<6U,_float> opposite;
  double dist;
  vec<6U,_float> *v;
  double dStack_48;
  uint i;
  double furthest_dist;
  vec<6U,_float> furthest;
  vq_node *parent_node_local;
  vec<6U,_float> *right_child_res_local;
  vec<6U,_float> *left_child_res_local;
  clusterizer<crnlib::vec<6U,_float>_> *this_local;
  
  furthest.m_s._16_8_ = parent_node;
  vec<6U,_float>::vec((vec<6U,_float> *)&furthest_dist,0.0);
  dStack_48 = -1.0;
  v._4_4_ = 0;
  while( true ) {
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(furthest.m_s._16_8_ + 0x28));
    if (uVar2 <= v._4_4_) break;
    puVar3 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)(furthest.m_s._16_8_ + 0x28),v._4_4_);
    this_00 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::operator[]
                        (&this->m_training_vecs,*puVar3);
    fVar4 = vec<6U,_float>::squared_distance(&this_00->first,(vec<6U,_float> *)furthest.m_s._16_8_);
    dVar5 = (double)fVar4;
    opposite.m_s._16_8_ = dVar5;
    if (dStack_48 < dVar5) {
      vec<6U,_float>::operator=((vec<6U,_float> *)&furthest_dist,&this_00->first);
      dStack_48 = dVar5;
    }
    v._4_4_ = v._4_4_ + 1;
  }
  vec<6U,_float>::vec((vec<6U,_float> *)&opposite_dist,0.0);
  dStack_80 = -1.0;
  v_1._4_4_ = 0;
  while( true ) {
    uVar1 = v_1._4_4_;
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(furthest.m_s._16_8_ + 0x28));
    if (uVar2 <= uVar1) break;
    puVar3 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)(furthest.m_s._16_8_ + 0x28),v_1._4_4_);
    dist_1 = (double)vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::operator[]
                               (&this->m_training_vecs,*puVar3);
    fVar4 = vec<6U,_float>::squared_distance
                      ((vec<6U,_float> *)dist_1,(vec<6U,_float> *)&furthest_dist);
    local_98 = (double)fVar4;
    if (dStack_80 < local_98) {
      dStack_80 = local_98;
      vec<6U,_float>::operator=((vec<6U,_float> *)&opposite_dist,(vec<6U,_float> *)dist_1);
    }
    v_1._4_4_ = v_1._4_4_ + 1;
  }
  operator+(&local_c8,(vec<6U,_float> *)&furthest_dist,(vec<6U,_float> *)furthest.m_s._16_8_);
  crnlib::operator*(&local_b0,&local_c8,0.5);
  vec<6U,_float>::operator=(left_child_res,&local_b0);
  operator+(&local_f8,(vec<6U,_float> *)&opposite_dist,(vec<6U,_float> *)furthest.m_s._16_8_);
  crnlib::operator*(&local_e0,&local_f8,0.5);
  vec<6U,_float>::operator=(right_child_res,&local_e0);
  return;
}

Assistant:

void compute_split_estimate(VectorType& left_child_res, VectorType& right_child_res, const vq_node& parent_node)
        {
            VectorType furthest(0);
            double furthest_dist = -1.0f;

            for (uint i = 0; i < parent_node.m_vectors.size(); i++)
            {
                const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

                double dist = v.squared_distance(parent_node.m_centroid);
                if (dist > furthest_dist)
                {
                    furthest_dist = dist;
                    furthest = v;
                }
            }

            VectorType opposite(0);
            double opposite_dist = -1.0f;

            for (uint i = 0; i < parent_node.m_vectors.size(); i++)
            {
                const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

                double dist = v.squared_distance(furthest);
                if (dist > opposite_dist)
                {
                    opposite_dist = dist;
                    opposite = v;
                }
            }

            left_child_res = (furthest + parent_node.m_centroid) * .5f;
            right_child_res = (opposite + parent_node.m_centroid) * .5f;
        }